

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_klass.cpp
# Opt level: O2

void __thiscall
HawkTracer::parser::EventKlass::add_field
          (EventKlass *this,
          unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
          *field)

{
  shared_ptr<HawkTracer::parser::EventKlassField> local_48 [2];
  undefined1 local_28 [16];
  
  std::mutex::lock(&this->_fields_mtx);
  std::__cxx11::string::string
            ((string *)local_48,
             (string *)
             (field->_M_t).
             super___uniq_ptr_impl<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
             ._M_t.
             super__Tuple_impl<0UL,_HawkTracer::parser::EventKlassField_*,_std::default_delete<HawkTracer::parser::EventKlassField>_>
             .super__Head_base<0UL,_HawkTracer::parser::EventKlassField_*,_false>._M_head_impl);
  _get_field((EventKlass *)local_28,(char *)this,
             (bool)local_48[0].
                   super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr._0_1_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
  std::__cxx11::string::~string((string *)local_48);
  if (local_28._0_8_ == 0) {
    std::__shared_ptr<HawkTracer::parser::EventKlassField,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<HawkTracer::parser::EventKlassField,std::default_delete<HawkTracer::parser::EventKlassField>,void>
              ((__shared_ptr<HawkTracer::parser::EventKlassField,(__gnu_cxx::_Lock_policy)2> *)
               local_48,field);
    std::
    vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>>>
    ::emplace_back<std::shared_ptr<HawkTracer::parser::EventKlassField>>
              ((vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>>>
                *)&this->_fields,local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48[0].
                super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void EventKlass::add_field(std::unique_ptr<EventKlassField> field)
{
    std::lock_guard<std::mutex> l(_fields_mtx);
    if (!_get_field(field->get_name().c_str(), false))
    {
        _fields.push_back(std::move(field));
    }
}